

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

void spawn_stdin_stdout(void)

{
  int iVar1;
  size_t __n;
  int *piVar2;
  ssize_t sVar3;
  uv_handle_t *handle;
  undefined1 *__buf;
  char buf [1024];
  undefined1 auStack_428 [1032];
  
LAB_0016cb1a:
  handle = (uv_handle_t *)0x0;
  __n = read(0,auStack_428,0x400);
  if (__n == 0xffffffffffffffff) goto code_r0x0016cb32;
  goto LAB_0016cb3c;
code_r0x0016cb32:
  piVar2 = __errno_location();
  if (*piVar2 != 4) {
LAB_0016cb3c:
    if (__n == 0) {
      return;
    }
    __buf = auStack_428;
    if ((long)__n < 1) {
LAB_0016cb8f:
      spawn_stdin_stdout_cold_1();
      iVar1 = uv_is_closing(handle);
      if (iVar1 == 0) {
        uv_close(handle,(uv_close_cb)0x0);
        return;
      }
      return;
    }
LAB_0016cb49:
    do {
      handle = (uv_handle_t *)0x1;
      sVar3 = write(1,__buf,__n);
      if (sVar3 == -1) {
        piVar2 = __errno_location();
        if (*piVar2 == 4) goto LAB_0016cb49;
      }
      if (sVar3 < 0) {
        spawn_stdin_stdout_cold_2();
        goto LAB_0016cb8f;
      }
      __n = __n - sVar3;
      __buf = __buf + sVar3;
    } while (__n != 0);
  }
  goto LAB_0016cb1a;
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT(r > 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT(w >= 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}